

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa.cc
# Opt level: O0

int DSA_generate_parameters_ex
              (DSA *dsa,uint bits,uint8_t *seed_in,size_t seed_len,int *out_counter,
              unsigned_long *out_h,BN_GENCB *cb)

{
  UniquePtr<BN_CTX> UVar1;
  long lVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  pointer pbVar7;
  BIGNUM *pBVar8;
  BIGNUM *a;
  BIGNUM *pBVar9;
  BIGNUM *ret;
  BIGNUM *a_00;
  BIGNUM *rem;
  BIGNUM *r_00;
  BIGNUM *r_01;
  BIGNUM *pBVar10;
  BN_MONT_CTX *__p;
  pointer mont_00;
  EVP_MD *local_178;
  unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter> local_170;
  UniquePtr<BN_MONT_CTX> mont;
  size_t i_2;
  size_t i_1;
  size_t i;
  int use_random_seed;
  BN_CTXScope scope;
  unique_ptr<bignum_ctx,_bssl::internal::Deleter> local_138;
  UniquePtr<BN_CTX> ctx;
  size_t qsize;
  EVP_MD *evpmd;
  uint h;
  int r;
  int counter;
  int m;
  int n;
  int k;
  BIGNUM *p;
  BIGNUM *q;
  BIGNUM *g;
  BIGNUM *test;
  BIGNUM *c;
  BIGNUM *X;
  BIGNUM *W;
  BIGNUM *r0;
  uchar buf2 [32];
  uchar buf [32];
  uchar md [32];
  uchar seed [32];
  unsigned_long *out_h_local;
  int *out_counter_local;
  size_t seed_len_local;
  uint8_t *seed_in_local;
  uint bits_local;
  DSA *dsa_local;
  
  if (10000 < bits) {
    ERR_put_error(10,0,0x6b,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dsa/dsa.cc"
                  ,0xaa);
    return 0;
  }
  r = 0;
  evpmd._0_4_ = 2;
  if (bits < 0x800) {
    local_178 = EVP_sha1();
  }
  else {
    local_178 = EVP_sha256();
  }
  ctx._M_t.super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl._0_4_ = EVP_MD_size(local_178);
  ctx._M_t.super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl._4_4_ = extraout_var;
  seed_in_local._4_4_ = bits;
  if (bits < 0x200) {
    seed_in_local._4_4_ = 0x200;
  }
  uVar4 = seed_in_local._4_4_ + 0x3f & 0xffffffc0;
  if (seed_in != (uint8_t *)0x0) {
    if (seed_len <
        (ulong)ctx._M_t.super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl) {
      return 0;
    }
    out_counter_local = (int *)seed_len;
    if ((ulong)ctx._M_t.super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl < seed_len) {
      out_counter_local =
           (int *)ctx._M_t.super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl;
    }
    OPENSSL_memcpy(md + 0x18,seed_in,(size_t)out_counter_local);
  }
  pbVar7 = (pointer)BN_CTX_new();
  std::unique_ptr<bignum_ctx,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<bignum_ctx,bssl::internal::Deleter> *)&local_138,pbVar7);
  bVar3 = std::operator==(&local_138,(nullptr_t)0x0);
  if (bVar3) {
    dsa_local._4_4_ = 0;
    scope.ctx_._4_4_ = 1;
    goto LAB_001b4d14;
  }
  pbVar7 = std::unique_ptr<bignum_ctx,_bssl::internal::Deleter>::get(&local_138);
  bssl::BN_CTXScope::BN_CTXScope((BN_CTXScope *)&stack0xfffffffffffffeb8,pbVar7);
  pbVar7 = std::unique_ptr<bignum_ctx,_bssl::internal::Deleter>::get(&local_138);
  pBVar8 = BN_CTX_get((BN_CTX *)pbVar7);
  pbVar7 = std::unique_ptr<bignum_ctx,_bssl::internal::Deleter>::get(&local_138);
  a = BN_CTX_get((BN_CTX *)pbVar7);
  pbVar7 = std::unique_ptr<bignum_ctx,_bssl::internal::Deleter>::get(&local_138);
  pBVar9 = BN_CTX_get((BN_CTX *)pbVar7);
  pbVar7 = std::unique_ptr<bignum_ctx,_bssl::internal::Deleter>::get(&local_138);
  ret = BN_CTX_get((BN_CTX *)pbVar7);
  pbVar7 = std::unique_ptr<bignum_ctx,_bssl::internal::Deleter>::get(&local_138);
  a_00 = BN_CTX_get((BN_CTX *)pbVar7);
  pbVar7 = std::unique_ptr<bignum_ctx,_bssl::internal::Deleter>::get(&local_138);
  rem = BN_CTX_get((BN_CTX *)pbVar7);
  pbVar7 = std::unique_ptr<bignum_ctx,_bssl::internal::Deleter>::get(&local_138);
  r_00 = BN_CTX_get((BN_CTX *)pbVar7);
  pbVar7 = std::unique_ptr<bignum_ctx,_bssl::internal::Deleter>::get(&local_138);
  r_01 = BN_CTX_get((BN_CTX *)pbVar7);
  if (r_01 != (BIGNUM *)0x0) {
    pBVar10 = BN_value_one();
    iVar5 = BN_lshift(r_01,pBVar10,uVar4 - 1);
    seed_len_local = (size_t)seed_in;
    if (iVar5 != 0) {
LAB_001b42fc:
      do {
        iVar5 = r + 1;
        iVar6 = BN_GENCB_call((BN_GENCB *)cb,0,r);
        if (iVar6 == 0) {
          dsa_local._4_4_ = 0;
          scope.ctx_._4_4_ = 1;
          goto LAB_001b4d08;
        }
        bVar3 = seed_len_local == 0;
        if (bVar3 == 0) {
          seed_len_local = 0;
        }
        else {
          iVar6 = RAND_bytes(md + 0x18,
                             (int)ctx._M_t.
                                  super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
                                  super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl);
          if (iVar6 == 0) {
            dsa_local._4_4_ = 0;
            scope.ctx_._4_4_ = 1;
            goto LAB_001b4d08;
          }
        }
        OPENSSL_memcpy(buf2 + 0x18,md + 0x18,
                       (size_t)ctx._M_t.super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>.
                               _M_t.super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl);
        OPENSSL_memcpy(&r0,md + 0x18,
                       (size_t)ctx._M_t.super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>.
                               _M_t.super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl);
        UVar1 = ctx;
        do {
          i_1 = (long)UVar1._M_t.super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl - 1;
          if ((ulong)ctx._M_t.super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl <= i_1) break;
          buf2[(long)UVar1._M_t.super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl + 0x17] =
               buf2[(long)UVar1._M_t.super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t
                          .super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl + 0x17] + '\x01';
          lVar2 = (long)UVar1._M_t.super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl + 0x17;
          UVar1._M_t.super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl =
               (__uniq_ptr_data<bignum_ctx,_bssl::internal::Deleter,_true,_true>)
               (__uniq_ptr_data<bignum_ctx,_bssl::internal::Deleter,_true,_true>)i_1;
        } while (buf2[lVar2] == '\0');
        iVar6 = EVP_Digest(md + 0x18,
                           (size_t)ctx._M_t.
                                   super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
                                   super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl,
                           buf + 0x18,(uint *)0x0,local_178,(ENGINE *)0x0);
        if ((iVar6 == 0) ||
           (iVar6 = EVP_Digest(buf2 + 0x18,
                               (size_t)ctx._M_t.
                                       super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>.
                                       _M_t.
                                       super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>
                                       .super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl,
                               (uchar *)&r0,(uint *)0x0,local_178,(ENGINE *)0x0), iVar6 == 0)) {
          dsa_local._4_4_ = 0;
          scope.ctx_._4_4_ = 1;
          goto LAB_001b4d08;
        }
        for (i_2 = 0; i_2 < (ulong)ctx._M_t.
                                   super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
                                   super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl;
            i_2 = i_2 + 1) {
          buf[i_2 + 0x18] = buf[i_2 + 0x18] ^ buf2[i_2 - 8];
        }
        buf[0x18] = buf[0x18] | 0x80;
        buf[(long)ctx._M_t.super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl + 0x17] =
             buf[(long)ctx._M_t.super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl + 0x17] | 1;
        pBVar10 = BN_bin2bn(buf + 0x18,
                            (int)ctx._M_t.super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>
                                 ._M_t.super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>
                                 .super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl,ret);
        if (pBVar10 == (BIGNUM *)0x0) {
          dsa_local._4_4_ = 0;
          scope.ctx_._4_4_ = 1;
          goto LAB_001b4d08;
        }
        pbVar7 = std::unique_ptr<bignum_ctx,_bssl::internal::Deleter>::get(&local_138);
        iVar6 = BN_is_prime_fasttest_ex(ret,0x32,(BN_CTX *)pbVar7,(uint)bVar3,(BN_GENCB *)cb);
        r = iVar5;
        if (0 < iVar6) {
          iVar5 = BN_GENCB_call((BN_GENCB *)cb,2,0);
          if ((iVar5 == 0) || (iVar5 = BN_GENCB_call((BN_GENCB *)cb,3,0), iVar5 == 0)) {
            dsa_local._4_4_ = 0;
            scope.ctx_._4_4_ = 1;
            goto LAB_001b4d08;
          }
          h = 0;
          do {
            if ((h != 0) && (iVar5 = BN_GENCB_call((BN_GENCB *)cb,0,h), iVar5 == 0)) {
              dsa_local._4_4_ = 0;
              scope.ctx_._4_4_ = 1;
              goto LAB_001b4d08;
            }
            BN_zero((BIGNUM *)pBVar9);
            for (m = 0; UVar1._M_t.super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl =
                             ctx._M_t.super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>.
                             _M_t.super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl,
                m <= (int)((uVar4 - 1) / 0xa0); m = m + 1) {
              do {
                mont._M_t.super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_bn_mont_ctx_st_*,_false>._M_head_impl =
                     (__uniq_ptr_data<bn_mont_ctx_st,_bssl::internal::Deleter,_true,_true>)
                     ((long)UVar1._M_t.super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>.
                            _M_t.super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl + -1);
                if ((ulong)ctx._M_t.super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl <=
                    (ulong)mont._M_t.super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>.
                           _M_t.super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_bn_mont_ctx_st_*,_false>._M_head_impl) break;
                buf2[(long)UVar1._M_t.super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>.
                           _M_t.super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl + 0x17] =
                     buf2[(long)UVar1._M_t.
                                super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
                                super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl + 0x17] +
                     '\x01';
                lVar2 = (long)UVar1._M_t.super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>.
                              _M_t.super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl + 0x17;
                UVar1._M_t.super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl =
                     (__uniq_ptr_data<bignum_ctx,_bssl::internal::Deleter,_true,_true>)
                     (__uniq_ptr_data<bignum_ctx,_bssl::internal::Deleter,_true,_true>)
                     mont._M_t.super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_bn_mont_ctx_st_*,_false>._M_head_impl;
              } while (buf2[lVar2] == '\0');
              iVar5 = EVP_Digest(buf2 + 0x18,
                                 (size_t)ctx._M_t.
                                         super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>.
                                         _M_t.
                                         super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>
                                         .super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl,
                                 buf + 0x18,(uint *)0x0,local_178,(ENGINE *)0x0);
              if (iVar5 == 0) {
                dsa_local._4_4_ = 0;
                scope.ctx_._4_4_ = 1;
                goto LAB_001b4d08;
              }
              pBVar10 = BN_bin2bn(buf + 0x18,
                                  (int)ctx._M_t.
                                       super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>.
                                       _M_t.
                                       super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>
                                       .super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl,
                                  pBVar8);
              if (((pBVar10 == (BIGNUM *)0x0) ||
                  (iVar5 = BN_lshift(pBVar8,pBVar8,
                                     (int)((long)ctx._M_t.
                                                 super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>
                                                 .super__Head_base<0UL,_bignum_ctx_*,_false>.
                                                 _M_head_impl << 3) * m), iVar5 == 0)) ||
                 (iVar5 = BN_add(pBVar9,pBVar9,pBVar8), iVar5 == 0)) {
                dsa_local._4_4_ = 0;
                scope.ctx_._4_4_ = 1;
                goto LAB_001b4d08;
              }
            }
            iVar5 = BN_mask_bits(pBVar9,uVar4 - 1);
            if (((iVar5 == 0) || (pBVar10 = BN_copy(a_00,pBVar9), pBVar10 == (BIGNUM *)0x0)) ||
               (iVar5 = BN_add(a_00,a_00,r_01), iVar5 == 0)) {
              dsa_local._4_4_ = 0;
              scope.ctx_._4_4_ = 1;
              goto LAB_001b4d08;
            }
            iVar5 = BN_lshift1(pBVar8,ret);
            if (iVar5 == 0) {
LAB_001b48ca:
              dsa_local._4_4_ = 0;
              scope.ctx_._4_4_ = 1;
              goto LAB_001b4d08;
            }
            pbVar7 = std::unique_ptr<bignum_ctx,_bssl::internal::Deleter>::get(&local_138);
            iVar5 = BN_div((BIGNUM *)0x0,rem,a_00,pBVar8,(BN_CTX *)pbVar7);
            if (iVar5 == 0) goto LAB_001b48ca;
            pBVar10 = BN_value_one();
            iVar5 = BN_sub(pBVar8,rem,pBVar10);
            if ((iVar5 == 0) || (iVar5 = BN_sub(r_00,a_00,pBVar8), iVar5 == 0)) goto LAB_001b48ca;
            iVar5 = BN_cmp(r_00,r_01);
            if (-1 < iVar5) {
              pbVar7 = std::unique_ptr<bignum_ctx,_bssl::internal::Deleter>::get(&local_138);
              iVar5 = BN_is_prime_fasttest_ex(r_00,0x32,(BN_CTX *)pbVar7,1,(BN_GENCB *)cb);
              if (0 < iVar5) {
                iVar5 = BN_GENCB_call((BN_GENCB *)cb,2,1);
                if (iVar5 == 0) {
                  dsa_local._4_4_ = 0;
                  scope.ctx_._4_4_ = 1;
                  goto LAB_001b4d08;
                }
                pBVar9 = BN_value_one();
                iVar5 = BN_sub(r_01,r_00,pBVar9);
                if (iVar5 != 0) {
                  pbVar7 = std::unique_ptr<bignum_ctx,_bssl::internal::Deleter>::get(&local_138);
                  iVar5 = BN_div(pBVar8,(BIGNUM *)0x0,r_01,ret,(BN_CTX *)pbVar7);
                  if (iVar5 != 0) {
                    pbVar7 = std::unique_ptr<bignum_ctx,_bssl::internal::Deleter>::get(&local_138);
                    __p = BN_MONT_CTX_new_for_modulus((BIGNUM *)r_00,pbVar7);
                    std::unique_ptr<bn_mont_ctx_st,bssl::internal::Deleter>::
                    unique_ptr<bssl::internal::Deleter,void>
                              ((unique_ptr<bn_mont_ctx_st,bssl::internal::Deleter> *)&local_170,__p)
                    ;
                    bVar3 = std::operator==(&local_170,(nullptr_t)0x0);
                    if ((!bVar3) && (iVar5 = BN_set_word(r_01,2), iVar5 != 0)) goto LAB_001b4ae1;
                    dsa_local._4_4_ = 0;
                    goto LAB_001b4cfc;
                  }
                }
                dsa_local._4_4_ = 0;
                scope.ctx_._4_4_ = 1;
                goto LAB_001b4d08;
              }
              if (iVar5 != 0) {
                dsa_local._4_4_ = 0;
                scope.ctx_._4_4_ = 1;
                goto LAB_001b4d08;
              }
            }
            h = h + 1;
          } while ((int)h < 0x1000);
          goto LAB_001b42fc;
        }
      } while (iVar6 == 0);
      dsa_local._4_4_ = 0;
      scope.ctx_._4_4_ = 1;
      goto LAB_001b4d08;
    }
  }
  dsa_local._4_4_ = 0;
  scope.ctx_._4_4_ = 1;
  goto LAB_001b4d08;
LAB_001b4ae1:
  pbVar7 = std::unique_ptr<bignum_ctx,_bssl::internal::Deleter>::get(&local_138);
  mont_00 = std::unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter>::get(&local_170);
  iVar5 = BN_mod_exp_mont((BIGNUM *)a,(BIGNUM *)r_01,(BIGNUM *)pBVar8,(BIGNUM *)r_00,pbVar7,mont_00)
  ;
  if (iVar5 == 0) goto code_r0x001b4b68;
  iVar5 = BN_is_one((BIGNUM *)a);
  if (iVar5 == 0) {
    iVar5 = BN_GENCB_call((BN_GENCB *)cb,3,1);
    if (iVar5 == 0) {
      dsa_local._4_4_ = 0;
    }
    else {
      BN_free((BIGNUM *)dsa->p);
      BN_free((BIGNUM *)dsa->q);
      BN_free((BIGNUM *)dsa->g);
      pBVar8 = BN_dup(r_00);
      dsa->p = (BIGNUM *)pBVar8;
      pBVar8 = BN_dup(ret);
      dsa->q = (BIGNUM *)pBVar8;
      pBVar8 = BN_dup(a);
      dsa->g = (BIGNUM *)pBVar8;
      if (((dsa->p == (BIGNUM *)0x0) || (dsa->q == (BIGNUM *)0x0)) || (dsa->g == (BIGNUM *)0x0)) {
        dsa_local._4_4_ = 0;
      }
      else {
        if (out_counter != (int *)0x0) {
          *out_counter = h;
        }
        if (out_h != (unsigned_long *)0x0) {
          *out_h = (ulong)(uint)evpmd;
        }
        dsa_local._4_4_ = 1;
      }
    }
    goto LAB_001b4cfc;
  }
  pBVar9 = BN_value_one();
  iVar5 = BN_add(r_01,r_01,pBVar9);
  if (iVar5 == 0) {
    dsa_local._4_4_ = 0;
    goto LAB_001b4cfc;
  }
  evpmd._0_4_ = (uint)evpmd + 1;
  goto LAB_001b4ae1;
code_r0x001b4b68:
  dsa_local._4_4_ = 0;
LAB_001b4cfc:
  scope.ctx_._4_4_ = 1;
  std::unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter>::~unique_ptr(&local_170);
LAB_001b4d08:
  bssl::BN_CTXScope::~BN_CTXScope((BN_CTXScope *)&stack0xfffffffffffffeb8);
LAB_001b4d14:
  std::unique_ptr<bignum_ctx,_bssl::internal::Deleter>::~unique_ptr(&local_138);
  return dsa_local._4_4_;
}

Assistant:

int DSA_generate_parameters_ex(DSA *dsa, unsigned bits, const uint8_t *seed_in,
                               size_t seed_len, int *out_counter,
                               unsigned long *out_h, BN_GENCB *cb) {
  if (bits > OPENSSL_DSA_MAX_MODULUS_BITS) {
    OPENSSL_PUT_ERROR(DSA, DSA_R_INVALID_PARAMETERS);
    return 0;
  }

  unsigned char seed[SHA256_DIGEST_LENGTH];
  unsigned char md[SHA256_DIGEST_LENGTH];
  unsigned char buf[SHA256_DIGEST_LENGTH], buf2[SHA256_DIGEST_LENGTH];
  BIGNUM *r0, *W, *X, *c, *test;
  BIGNUM *g = NULL, *q = NULL, *p = NULL;
  int k, n = 0, m = 0;
  int counter = 0;
  int r = 0;
  unsigned int h = 2;
  const EVP_MD *evpmd;

  evpmd = (bits >= 2048) ? EVP_sha256() : EVP_sha1();
  size_t qsize = EVP_MD_size(evpmd);

  if (bits < 512) {
    bits = 512;
  }

  bits = (bits + 63) / 64 * 64;

  if (seed_in != NULL) {
    if (seed_len < qsize) {
      return 0;
    }
    if (seed_len > qsize) {
      // Only consume as much seed as is expected.
      seed_len = qsize;
    }
    OPENSSL_memcpy(seed, seed_in, seed_len);
  }

  bssl::UniquePtr<BN_CTX> ctx(BN_CTX_new());
  if (ctx == nullptr) {
    return 0;
  }
  bssl::BN_CTXScope scope(ctx.get());

  r0 = BN_CTX_get(ctx.get());
  g = BN_CTX_get(ctx.get());
  W = BN_CTX_get(ctx.get());
  q = BN_CTX_get(ctx.get());
  X = BN_CTX_get(ctx.get());
  c = BN_CTX_get(ctx.get());
  p = BN_CTX_get(ctx.get());
  test = BN_CTX_get(ctx.get());

  if (test == NULL || !BN_lshift(test, BN_value_one(), bits - 1)) {
    return 0;
  }

  for (;;) {
    // Find q.
    for (;;) {
      // step 1
      if (!BN_GENCB_call(cb, BN_GENCB_GENERATED, m++)) {
        return 0;
      }

      int use_random_seed = (seed_in == NULL);
      if (use_random_seed) {
        if (!RAND_bytes(seed, qsize)) {
          return 0;
        }
        // DSA parameters are public.
        CONSTTIME_DECLASSIFY(seed, qsize);
      } else {
        // If we come back through, use random seed next time.
        seed_in = NULL;
      }
      OPENSSL_memcpy(buf, seed, qsize);
      OPENSSL_memcpy(buf2, seed, qsize);
      // precompute "SEED + 1" for step 7:
      for (size_t i = qsize - 1; i < qsize; i--) {
        buf[i]++;
        if (buf[i] != 0) {
          break;
        }
      }

      // step 2
      if (!EVP_Digest(seed, qsize, md, NULL, evpmd, NULL) ||
          !EVP_Digest(buf, qsize, buf2, NULL, evpmd, NULL)) {
        return 0;
      }
      for (size_t i = 0; i < qsize; i++) {
        md[i] ^= buf2[i];
      }

      // step 3
      md[0] |= 0x80;
      md[qsize - 1] |= 0x01;
      if (!BN_bin2bn(md, qsize, q)) {
        return 0;
      }

      // step 4
      r = BN_is_prime_fasttest_ex(q, DSS_prime_checks, ctx.get(),
                                  use_random_seed, cb);
      if (r > 0) {
        break;
      }
      if (r != 0) {
        return 0;
      }

      // do a callback call
      // step 5
    }

    if (!BN_GENCB_call(cb, 2, 0) || !BN_GENCB_call(cb, 3, 0)) {
      return 0;
    }

    // step 6
    counter = 0;
    // "offset = 2"

    n = (bits - 1) / 160;

    for (;;) {
      if ((counter != 0) && !BN_GENCB_call(cb, BN_GENCB_GENERATED, counter)) {
        return 0;
      }

      // step 7
      BN_zero(W);
      // now 'buf' contains "SEED + offset - 1"
      for (k = 0; k <= n; k++) {
        // obtain "SEED + offset + k" by incrementing:
        for (size_t i = qsize - 1; i < qsize; i--) {
          buf[i]++;
          if (buf[i] != 0) {
            break;
          }
        }

        if (!EVP_Digest(buf, qsize, md, NULL, evpmd, NULL)) {
          return 0;
        }

        // step 8
        if (!BN_bin2bn(md, qsize, r0) || !BN_lshift(r0, r0, (qsize << 3) * k) ||
            !BN_add(W, W, r0)) {
          return 0;
        }
      }

      // more of step 8
      if (!BN_mask_bits(W, bits - 1) || !BN_copy(X, W) || !BN_add(X, X, test)) {
        return 0;
      }

      // step 9
      if (!BN_lshift1(r0, q) || !BN_mod(c, X, r0, ctx.get()) ||
          !BN_sub(r0, c, BN_value_one()) || !BN_sub(p, X, r0)) {
        return 0;
      }

      // step 10
      if (BN_cmp(p, test) >= 0) {
        // step 11
        r = BN_is_prime_fasttest_ex(p, DSS_prime_checks, ctx.get(), 1, cb);
        if (r > 0) {
          goto end;  // found it
        }
        if (r != 0) {
          return 0;
        }
      }

      // step 13
      counter++;
      // "offset = offset + n + 1"

      // step 14
      if (counter >= 4096) {
        break;
      }
    }
  }
end:
  if (!BN_GENCB_call(cb, 2, 1)) {
    return 0;
  }

  // We now need to generate g
  // Set r0=(p-1)/q
  if (!BN_sub(test, p, BN_value_one()) ||
      !BN_div(r0, NULL, test, q, ctx.get())) {
    return 0;
  }

  bssl::UniquePtr<BN_MONT_CTX> mont(BN_MONT_CTX_new_for_modulus(p, ctx.get()));
  if (mont == nullptr || !BN_set_word(test, h)) {
    return 0;
  }

  for (;;) {
    // g=test^r0%p
    if (!BN_mod_exp_mont(g, test, r0, p, ctx.get(), mont.get())) {
      return 0;
    }
    if (!BN_is_one(g)) {
      break;
    }
    if (!BN_add(test, test, BN_value_one())) {
      return 0;
    }
    h++;
  }

  if (!BN_GENCB_call(cb, 3, 1)) {
    return 0;
  }

  BN_free(dsa->p);
  BN_free(dsa->q);
  BN_free(dsa->g);
  dsa->p = BN_dup(p);
  dsa->q = BN_dup(q);
  dsa->g = BN_dup(g);
  if (dsa->p == NULL || dsa->q == NULL || dsa->g == NULL) {
    return 0;
  }
  if (out_counter != NULL) {
    *out_counter = counter;
  }
  if (out_h != NULL) {
    *out_h = h;
  }

  return 1;
}